

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_search.cpp
# Opt level: O3

int si9ma::BinarySearch::find_local_min(int *arr,int L,int R)

{
  int iVar1;
  int iVar2;
  undefined8 *puVar3;
  int iVar4;
  
  if (R < L) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = "invalid length";
    __cxa_throw(puVar3,&char_const*::typeinfo,0);
  }
  iVar4 = R;
  if (((R != L) && (iVar4 = L, arr[(long)L + 1] <= arr[L])) &&
     (iVar4 = R, arr[(long)R + -1] <= arr[R])) {
    while( true ) {
      iVar2 = (R - L) / 2;
      iVar4 = iVar2 + L;
      iVar1 = arr[iVar4];
      if ((iVar1 < arr[(long)iVar4 + -1]) && (iVar1 < arr[(long)iVar4 + 1])) break;
      if (arr[(long)iVar4 + -1] < iVar1) {
        R = iVar2 + L + -1;
      }
      else {
        L = iVar4 + 1;
      }
    }
  }
  return iVar4;
}

Assistant:

int BinarySearch::find_local_min(int *arr, int L,int R) {
        if(R < L)
            throw "invalid length";

        if(L == R)
            return L;

        if(arr[L] < arr[L + 1])
            return L;

        if(arr[R] < arr[R - 1])
            return R;

        while (L <= R){
            int mid = L + (R - L)/2;

            if(arr[mid] < arr[mid - 1] && arr[mid] < arr[mid + 1])
                return mid;

            if(arr[mid] > arr[mid - 1]){
                R = mid - 1;
                continue;
            }

            L = mid + 1;
        }
    }